

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>
::lock(guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *this)

{
  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *in_RSI;
  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *in_RDI;
  pointer in_stack_ffffffffffffffa8;
  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *val;
  unique_lock<std::mutex> local_20 [2];
  
  if ((in_RSI[2].m_handle_lock._M_owns & 1U) == 0) {
    val = in_RDI;
    std::unique_lock<std::mutex>::unique_lock(local_20);
    lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::lock_handle
              (in_RSI,(pointer)val,(unique_lock<std::mutex> *)in_RDI);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  }
  else {
    lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::lock_handle
              (in_RDI,in_stack_ffffffffffffffa8,(mutex *)0x36ed67);
    val = in_RDI;
  }
  return val;
}

Assistant:

auto guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}